

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_var_thresh_percentile
              (vector_t ***var,float32 **var_thresh,uint32 n_mgau,uint32 n_stream,uint32 n_density,
              uint32 *veclen,float32 percent)

{
  float *pfVar1;
  int *piVar2;
  uint uVar3;
  vector_t pfVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong n_elem;
  ulong uVar14;
  float fVar15;
  
  n_elem = (ulong)n_stream;
  pvVar5 = __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x73b);
  pvVar6 = __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x73c);
  pvVar7 = __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x73d);
  for (uVar10 = 0; uVar10 != n_elem; uVar10 = uVar10 + 1) {
    pvVar8 = __ckd_calloc__((ulong)veclen[uVar10],8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                            ,0x740);
    *(void **)((long)pvVar5 + uVar10 * 8) = pvVar8;
    pvVar8 = __ckd_calloc__((ulong)veclen[uVar10],4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                            ,0x741);
    *(void **)((long)pvVar6 + uVar10 * 8) = pvVar8;
    pvVar8 = __ckd_calloc__((ulong)veclen[uVar10],4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                            ,0x742);
    *(void **)((long)pvVar7 + uVar10 * 8) = pvVar8;
    for (uVar14 = 0; uVar14 < veclen[uVar10]; uVar14 = uVar14 + 1) {
      pvVar8 = __ckd_calloc__(4000,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                              ,0x744);
      *(void **)(*(long *)((long)pvVar5 + uVar10 * 8) + uVar14 * 8) = pvVar8;
      *(undefined4 *)(*(long *)((long)pvVar7 + uVar10 * 8) + uVar14 * 4) = 0x8082ab1e;
      *(undefined4 *)(*(long *)((long)pvVar6 + uVar10 * 8) + uVar14 * 4) = 0x7f7fc99e;
    }
  }
  for (uVar10 = 0; uVar10 != n_mgau; uVar10 = uVar10 + 1) {
    for (uVar14 = 0; uVar14 != n_elem; uVar14 = uVar14 + 1) {
      for (uVar9 = 0; uVar9 != n_density; uVar9 = uVar9 + 1) {
        uVar3 = veclen[uVar14];
        for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
          pfVar4 = var[uVar10][uVar14][uVar9];
          fVar15 = pfVar4[uVar12];
          lVar11 = *(long *)((long)pvVar7 + uVar14 * 8);
          pfVar1 = (float *)(lVar11 + uVar12 * 4);
          if (*pfVar1 <= fVar15 && fVar15 != *pfVar1) {
            *(float *)(lVar11 + uVar12 * 4) = fVar15;
            fVar15 = pfVar4[uVar12];
          }
          if ((0.0 < fVar15) &&
             (lVar11 = *(long *)((long)pvVar6 + uVar14 * 8),
             fVar15 < *(float *)(lVar11 + uVar12 * 4))) {
            *(float *)(lVar11 + uVar12 * 4) = fVar15;
          }
        }
      }
    }
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x759,"var_extrema:\n");
  for (uVar10 = 0; uVar10 != n_elem; uVar10 = uVar10 + 1) {
    err_msg(ERR_INFOCONT,(char *)0x0,0,"\tstream %u: ");
    for (uVar14 = 0; uVar14 < veclen[uVar10]; uVar14 = uVar14 + 1) {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"\t\t[%.4e %.4e]",
              (double)*(float *)(*(long *)((long)pvVar6 + uVar10 * 8) + uVar14 * 4));
    }
    err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
  }
  for (uVar10 = 0; uVar10 != n_elem; uVar10 = uVar10 + 1) {
    uVar3 = veclen[uVar10];
    for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
      lVar11 = *(long *)((long)pvVar7 + uVar10 * 8);
      *(float *)(lVar11 + uVar14 * 4) =
           (*(float *)(lVar11 + uVar14 * 4) -
           *(float *)(*(long *)((long)pvVar6 + uVar10 * 8) + uVar14 * 4)) / 4000.0;
    }
  }
  for (uVar10 = 0; uVar10 != n_elem; uVar10 = uVar10 + 1) {
    for (uVar14 = 0; uVar14 < veclen[uVar10]; uVar14 = uVar14 + 1) {
      for (uVar9 = 0; uVar9 != n_mgau; uVar9 = uVar9 + 1) {
        for (uVar12 = 0; n_density != uVar12; uVar12 = uVar12 + 1) {
          if (0.0 < var[uVar9][uVar10][uVar12][uVar14]) {
            fVar15 = floorf((var[uVar9][uVar10][uVar12][uVar14] -
                            *(float *)(*(long *)((long)pvVar6 + uVar10 * 8) + uVar14 * 4)) /
                            *(float *)(*(long *)((long)pvVar7 + uVar10 * 8) + uVar14 * 4));
            piVar2 = (int *)(*(long *)(*(long *)((long)pvVar5 + uVar10 * 8) + uVar14 * 8) +
                            ((long)fVar15 & 0xffffffffU) * 4);
            *piVar2 = *piVar2 + 1;
          }
        }
      }
    }
  }
  uVar10 = 0;
  do {
    if (uVar10 == n_elem) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
              ,0x786,"var_extrema:\n");
      for (uVar10 = 0; uVar10 != n_elem; uVar10 = uVar10 + 1) {
        err_msg(ERR_INFOCONT,(char *)0x0,0,"\tstream %u: ",uVar10 & 0xffffffff);
        for (uVar14 = 0; uVar14 < veclen[uVar10]; uVar14 = uVar14 + 1) {
          err_msg(ERR_INFOCONT,(char *)0x0,0,"\t\t%.4e",(double)(float)var_thresh[uVar10][uVar14]);
        }
        err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
      }
      return 0;
    }
    uVar3 = veclen[uVar10];
    for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
      uVar13 = 0;
      for (lVar11 = 0; lVar11 != 4000; lVar11 = lVar11 + 1) {
        uVar13 = uVar13 + *(int *)(*(long *)(*(long *)((long)pvVar5 + uVar10 * 8) + uVar14 * 8) +
                                  lVar11 * 4);
        if ((float)percent / 100.0 < (float)uVar13 / (float)(n_density * n_mgau)) {
          fVar15 = (float)((int)lVar11 + 1);
          goto LAB_00113362;
        }
      }
      fVar15 = 4001.0;
LAB_00113362:
      var_thresh[uVar10][uVar14] =
           (float32)(fVar15 * *(float *)(*(long *)((long)pvVar7 + uVar10 * 8) + uVar14 * 4) +
                    *(float *)(*(long *)((long)pvVar6 + uVar10 * 8) + uVar14 * 4));
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

int
gauden_var_thresh_percentile(vector_t ***var,
			     float32 **var_thresh,
			     uint32 n_mgau,
			     uint32 n_stream,
			     uint32 n_density,
			     const uint32 *veclen,
			     float32 percent)
{
    float32 f = percent / 100.0;
    uint32 ***histo;
    float32 **min;
    float32 **max;
    float32 **bin_wdth;
    uint32 i, j, k, l, b, t;
    float32 gt;

    histo = (uint32 ***)ckd_calloc(n_stream, sizeof(uint32 **));
    min = (float32 **)ckd_calloc(n_stream, sizeof(float32 *));
    max = (float32 **)ckd_calloc(n_stream, sizeof(float32 *));

    for (j = 0; j < n_stream; j++) {
	histo[j] = ckd_calloc(veclen[j], sizeof(uint32 *));
	min[j] = ckd_calloc(veclen[j], sizeof(float32));
	max[j] = ckd_calloc(veclen[j], sizeof(float32));
	for (l = 0; l < veclen[j]; l++) {
	    histo[j][l] = ckd_calloc(N_BIN, sizeof(uint32));
	    max[j][l] = MIN_NEG_FLOAT32;
	    min[j][l] = MAX_POS_FLOAT32;
	}
    }

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_stream; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    if (var[i][j][k][l] > max[j][l]) {
			max[j][l] = var[i][j][k][l];
		    }
		    if ((var[i][j][k][l] > 0) && (var[i][j][k][l] < min[j][l])) {
			min[j][l] = var[i][j][k][l];
		    }
		}
	    }
	}
    }

    E_INFO("var_extrema:\n");
    for (j = 0; j < n_stream; j++) {
	E_INFOCONT("\tstream %u: ", j);
	for (l = 0; l < veclen[j]; l++) {
	    E_INFOCONT("\t\t[%.4e %.4e]", min[j][l], max[j][l]);
	}
        E_INFOCONT("\n");
    }

    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    max[j][l] = (max[j][l] - min[j][l]) / (float32)N_BIN;
	}
    }

    bin_wdth = max;

    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    for (i = 0; i < n_mgau; i++) {
		for (k = 0; k < n_density; k++) {
		    if (var[i][j][k][l] > 0) {
			b = (uint32)floor((var[i][j][k][l] - min[j][l]) / bin_wdth[j][l]);
			++histo[j][l][b];
		    }
		}
	    }
	}
    }

    /* grand total # of variances for each stream */
    gt = n_mgau * n_density;

    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    t = 0;
	    for (b = 0; b < N_BIN; b++) {
		t += histo[j][l][b];
		if (((float32)t / gt) > f)
		    break;
	    }
	    var_thresh[j][l] = min[j][l] + (b+1) * bin_wdth[j][l];
	}
    }
    
    E_INFO("var_extrema:\n");
    for (j = 0; j < n_stream; j++) {
	E_INFOCONT("\tstream %u: ", j);
	for (l = 0; l < veclen[j]; l++) {
	    E_INFOCONT("\t\t%.4e", var_thresh[j][l]);
	}
        E_INFOCONT("\n");
    }

    return S3_SUCCESS;
}